

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang_model.cpp
# Opt level: O2

bool __thiscall NJamSpell::TLangModel::Dump(TLangModel *this,string *modelFileName)

{
  char cVar1;
  ostream local_218 [8];
  ofstream out;
  
  std::ofstream::ofstream(local_218,(string *)modelFileName,_S_bin);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    NHandyPack::TPodSerializer<unsigned_long>::Dump(local_218,&LANG_MODEL_MAGIC_BYTE);
    NHandyPack::TPodSerializer<unsigned_short>::Dump(local_218,&LANG_MODEL_VERSION);
    (**this->_vptr_TLangModel)(this,local_218);
    NHandyPack::TPodSerializer<unsigned_long>::Dump(local_218,&LANG_MODEL_MAGIC_BYTE);
  }
  std::ofstream::~ofstream(local_218);
  return (bool)cVar1;
}

Assistant:

bool TLangModel::Dump(const std::string& modelFileName) const {
    std::ofstream out(modelFileName, std::ios::binary);
    if (!out.is_open()) {
        return false;
    }
    NHandyPack::Dump(out, LANG_MODEL_MAGIC_BYTE);
    NHandyPack::Dump(out, LANG_MODEL_VERSION);
    Dump(out);
    NHandyPack::Dump(out, LANG_MODEL_MAGIC_BYTE);
    return true;
}